

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall cmCPackGenerator::DoPackage(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  _Alloc_hider destination;
  cmCPackGenerator *this_00;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  pointer pbVar8;
  char *pcVar9;
  int local_27c;
  string tmpPF;
  allocator local_251;
  cmCPackGenerator *local_250;
  string local_248;
  pointer local_228;
  Glob gl;
  ostringstream cmCPackLog_msg;
  string findExpr;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Create package using ");
  poVar4 = std::operator<<(poVar4,(string *)&this->Name);
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x403,(char *)gl.Internals);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  iVar3 = PrepareNames(this);
  if (iVar3 == 0) {
    return 0;
  }
  iVar3 = (*(this->super_cmObject)._vptr_cmObject[7])(this);
  if (iVar3 == 0) {
    return 0;
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_REMOVE_TOPLEVEL_DIRECTORY",(allocator *)&gl);
  pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
  bVar2 = cmSystemTools::IsOn(pcVar5);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (bVar2) {
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)&gl);
    pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    bVar2 = cmsys::SystemTools::FileExists(pcVar5);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Remove toplevel directory: ");
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x41b,(char *)gl.Internals);
      std::__cxx11::string::~string((string *)&gl);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      bVar2 = cmSystemTools::RepeatedRemoveDirectory(pcVar5);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem removing toplevel directory: ")
        ;
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x421,(char *)gl.Internals);
        std::__cxx11::string::~string((string *)&gl);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        return 0;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"About to install project ");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x427,(char *)gl.Internals);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  iVar3 = InstallProject(this);
  if (iVar3 == 0) {
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Done install project ");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x42e,(char *)gl.Internals);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",(allocator *)&gl);
  pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",(allocator *)&gl);
  pcVar6 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Find files");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x435,(char *)gl.Internals);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  cmsys::Glob::Glob(&gl);
  std::__cxx11::string::string((string *)&findExpr,pcVar6,(allocator *)&cmCPackLog_msg);
  std::__cxx11::string::append((char *)&findExpr);
  gl.Recurse = true;
  gl.RecurseListDirs = true;
  gl.RecurseThroughSymlinks = false;
  bVar2 = cmsys::Glob::FindFiles(&gl,&findExpr,(GlobMessages *)0x0);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Create package");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    local_27c = 1;
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x443,tmpPF._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&tmpPF);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Package files to: ");
    pcVar6 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      pcVar6 = "(NULL)";
    }
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x445,tmpPF._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&tmpPF);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    bVar2 = cmsys::SystemTools::FileExists(pcVar5);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Remove old package file");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x449,tmpPF._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&tmpPF);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar5,(allocator *)&tmpPF);
      cmsys::SystemTools::RemoveFile((string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY",(allocator *)&tmpPF);
    pcVar6 = GetOption(this,(string *)&cmCPackLog_msg);
    bVar2 = cmSystemTools::IsOn(pcVar6);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)&tmpPF);
      GetOption(this,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    pvVar7 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->files,pvVar7);
    pvVar7 = &this->packageFileNames;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(pvVar7);
    pcVar6 = "";
    if (pcVar5 != (char *)0x0) {
      pcVar6 = pcVar5;
    }
    std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar6,(allocator *)&tmpPF);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmCPackLog_msg)
    ;
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::assign((char *)&this->toplevel);
    iVar3 = (*(this->super_cmObject)._vptr_cmObject[10])(this);
    if ((iVar3 != 0) && (bVar2 = cmSystemTools::GetErrorOccuredFlag(), !bVar2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Copying final package(s) [");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"]:");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x46c,tmpPF._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&tmpPF);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      pbVar8 = (pvVar7->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_250 = this;
      do {
        this_00 = local_250;
        local_228 = pbVar8;
        if (pbVar8 == (local_250->packageFileNames).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0028488d;
        std::__cxx11::string::string
                  ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_PREFIX",(allocator *)&local_248);
        pcVar5 = GetOption(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&cmCPackLog_msg);
        std::__cxx11::string::string((string *)&tmpPF,pcVar5,&local_251);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        pcVar5 = (local_228->_M_dataplus)._M_p;
        cmsys::SystemTools::GetFilenameName(&local_248,local_228);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCPackLog_msg,"/",&local_248);
        std::__cxx11::string::append((string *)&tmpPF);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&local_248);
        destination = tmpPF._M_dataplus;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Copy final package(s): ");
        pcVar6 = pcVar5;
        if (pcVar5 == (char *)0x0) {
          pcVar6 = "(NULL)";
        }
        poVar4 = std::operator<<(poVar4,pcVar6);
        poVar4 = std::operator<<(poVar4," to ");
        pcVar9 = (char *)destination;
        if (destination._M_p == (pointer)0x0) {
          pcVar9 = "(NULL)";
        }
        poVar4 = std::operator<<(poVar4,pcVar9);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = local_250->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x479,local_248._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        bVar2 = cmSystemTools::CopyFileIfDifferent(pcVar5,destination._M_p);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"- package: ");
          poVar4 = std::operator<<(poVar4,destination._M_p);
          poVar4 = std::operator<<(poVar4," generated.");
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar1 = local_250->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x486,local_248._M_dataplus._M_p);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem copying the package: ");
          poVar4 = std::operator<<(poVar4,pcVar6);
          poVar4 = std::operator<<(poVar4," to ");
          poVar4 = std::operator<<(poVar4,pcVar9);
          std::endl<char,std::char_traits<char>>(poVar4);
          pcVar1 = local_250->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x481,local_248._M_dataplus._M_p);
        }
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&tmpPF);
        pbVar8 = local_228 + 1;
      } while (bVar2);
      goto LAB_00284885;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem compressing the directory");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x460,tmpPF._M_dataplus._M_p);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "Cannot find any files in the packaging tree");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x43f,tmpPF._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&tmpPF);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_00284885:
  local_27c = 0;
LAB_0028488d:
  std::__cxx11::string::~string((string *)&findExpr);
  cmsys::Glob::~Glob(&gl);
  return local_27c;
}

Assistant:

int cmCPackGenerator::DoPackage()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT,
    "Create package using " << this->Name << std::endl);

  // Prepare CPack internal name and check
  // values for many CPACK_xxx vars
  if ( !this->PrepareNames() )
    {
    return 0;
    }

  // Digest Component grouping specification
  if ( !this->PrepareGroupingKind() )
    {
    return 0;
    }

  if ( cmSystemTools::IsOn(
      this->GetOption("CPACK_REMOVE_TOPLEVEL_DIRECTORY")) )
    {
    const char* toplevelDirectory
      = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    if ( cmSystemTools::FileExists(toplevelDirectory) )
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Remove toplevel directory: "
        << toplevelDirectory << std::endl);
      if ( !cmSystemTools::RepeatedRemoveDirectory(toplevelDirectory) )
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Problem removing toplevel directory: "
          << toplevelDirectory
          << std::endl);
        return 0;
        }
      }
    }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "About to install project " << std::endl);

  if ( !this->InstallProject() )
    {
    return 0;
    }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Done install project " << std::endl);


  const char* tempPackageFileName = this->GetOption(
    "CPACK_TEMPORARY_PACKAGE_FILE_NAME");
  const char* tempDirectory = this->GetOption("CPACK_TEMPORARY_DIRECTORY");

  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
  cmsys::Glob gl;
  std::string findExpr = tempDirectory;
  findExpr += "/*";
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  gl.SetRecurseThroughSymlinks(false);
  if ( !gl.FindFiles(findExpr) )
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
      "Cannot find any files in the packaging tree" << std::endl);
    return 0;
    }

  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Create package" << std::endl);
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Package files to: "
    << (tempPackageFileName ? tempPackageFileName : "(NULL)") << std::endl);
  if ( cmSystemTools::FileExists(tempPackageFileName) )
    {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Remove old package file"
      << std::endl);
    cmSystemTools::RemoveFile(tempPackageFileName);
    }
  if ( cmSystemTools::IsOn(this->GetOption(
        "CPACK_INCLUDE_TOPLEVEL_DIRECTORY")) )
    {
    tempDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    }

  // The files to be installed
  files = gl.GetFiles();

  packageFileNames.clear();
  /* Put at least one file name into the list of
   * wanted packageFileNames. The specific generator
   * may update this during PackageFiles.
   * (either putting several names or updating the provided one)
   */
  packageFileNames.push_back(tempPackageFileName ? tempPackageFileName : "");
  toplevel = tempDirectory;
  if ( !this->PackageFiles() || cmSystemTools::GetErrorOccuredFlag())
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem compressing the directory"
      << std::endl);
    return 0;
    }

  /*
   * Copy the generated packages to final destination
   *  - there may be several of them
   *  - the initially provided name may have changed
   *    (because the specific generator did 'normalize' it)
   */
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Copying final package(s) ["
                   <<packageFileNames.size()
                   <<"]:"<<std::endl);
  std::vector<std::string>::iterator it;
  /* now copy package one by one */
  for (it=packageFileNames.begin();it!=packageFileNames.end();++it)
    {
    std::string tmpPF(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
    tempPackageFileName = it->c_str();
    tmpPF += "/"+cmSystemTools::GetFilenameName(*it);
    const char* packageFileName = tmpPF.c_str();
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "Copy final package(s): "
        << (tempPackageFileName ? tempPackageFileName : "(NULL)" )
        << " to "
        << (packageFileName ? packageFileName : "(NULL)")
        << std::endl);
    if ( !cmSystemTools::CopyFileIfDifferent(tempPackageFileName,
        packageFileName) )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem copying the package: "
          << (tempPackageFileName ? tempPackageFileName : "(NULL)" )
          << " to "
          << (packageFileName ? packageFileName : "(NULL)")
          << std::endl);
      return 0;
      }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- package: "
        << packageFileName
        << " generated." << std::endl);
    }

  return 1;
}